

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

StructDef * __thiscall
flatbuffers::Parser::LookupCreateStruct
          (Parser *this,string *name,bool create_if_new,bool definition)

{
  StructDef *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string qualified_name;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Namespace::GetFullyQualifiedName(&qualified_name,this->current_namespace_,name,1000);
  this_00 = LookupStruct(this,name);
  if ((this_00 != (StructDef *)0x0) && (this_00->predecl == true)) {
    if (definition) {
      (this_00->super_Definition).defined_namespace = this->current_namespace_;
      SymbolTable<flatbuffers::StructDef>::Move(&this->structs_,name,&qualified_name);
    }
    goto LAB_001060e4;
  }
  this_00 = LookupStruct(this,&qualified_name);
  if (this_00 == (StructDef *)0x0) {
    if (definition) {
      this_00 = (StructDef *)0x0;
    }
    else {
      this_00 = LookupStructThruParentNamespaces(this,name);
    }
    if (!create_if_new || this_00 != (StructDef *)0x0) goto LAB_001060e4;
    this_00 = (StructDef *)operator_new(0x148);
    StructDef::StructDef(this_00);
    if (!definition) {
      SymbolTable<flatbuffers::StructDef>::Add(&this->structs_,name,this_00);
      std::__cxx11::string::_M_assign((string *)this_00);
      (this_00->super_Definition).defined_namespace = this->current_namespace_;
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
      std::operator+(&local_48,&this->file_being_parsed_,":");
      NumToString<int>(&local_68,(this->super_ParserState).line_);
      std::operator+(__return_storage_ptr__,&local_48,&local_68);
      std::
      __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this_00->original_location,__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      goto LAB_001060e4;
    }
    SymbolTable<flatbuffers::StructDef>::Add(&this->structs_,&qualified_name,this_00);
    std::__cxx11::string::_M_assign((string *)this_00);
  }
  else if ((definition & this_00->predecl) != 1) goto LAB_001060e4;
  (this_00->super_Definition).defined_namespace = this->current_namespace_;
LAB_001060e4:
  std::__cxx11::string::~string((string *)&qualified_name);
  return this_00;
}

Assistant:

StructDef *Parser::LookupCreateStruct(const std::string &name,
                                      bool create_if_new, bool definition) {
  std::string qualified_name = current_namespace_->GetFullyQualifiedName(name);
  // See if it exists pre-declared by an unqualified use.
  auto struct_def = LookupStruct(name);
  if (struct_def && struct_def->predecl) {
    if (definition) {
      // Make sure it has the current namespace, and is registered under its
      // qualified name.
      struct_def->defined_namespace = current_namespace_;
      structs_.Move(name, qualified_name);
    }
    return struct_def;
  }
  // See if it exists pre-declared by an qualified use.
  struct_def = LookupStruct(qualified_name);
  if (struct_def && struct_def->predecl) {
    if (definition) {
      // Make sure it has the current namespace.
      struct_def->defined_namespace = current_namespace_;
    }
    return struct_def;
  }
  if (!definition && !struct_def) {
    struct_def = LookupStructThruParentNamespaces(name);
  }
  if (!struct_def && create_if_new) {
    struct_def = new StructDef();
    if (definition) {
      structs_.Add(qualified_name, struct_def);
      struct_def->name = name;
      struct_def->defined_namespace = current_namespace_;
    } else {
      // Not a definition.
      // Rather than failing, we create a "pre declared" StructDef, due to
      // circular references, and check for errors at the end of parsing.
      // It is defined in the current namespace, as the best guess what the
      // final namespace will be.
      structs_.Add(name, struct_def);
      struct_def->name = name;
      struct_def->defined_namespace = current_namespace_;
      struct_def->original_location.reset(
          new std::string(file_being_parsed_ + ":" + NumToString(line_)));
    }
  }
  return struct_def;
}